

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::IncrementFunction::eval
          (IncrementFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  undefined1 isSigned;
  ConstantValue *in_RDI;
  DimResult dim;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  ConstantValue *pCVar1;
  SVInt *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff2b;
  bitwidth_t in_stack_ffffffffffffff2c;
  long local_48;
  ConstantRange local_40;
  byte local_38;
  byte local_37;
  byte local_36;
  
  pCVar1 = in_RDI;
  ArrayQueryFunction::getDim
            ((ArrayQueryFunction *)param_4.endLoc,(EvalContext *)param_4.startLoc,(Args *)this);
  if ((local_38 & 1) == 0) {
    if ((local_36 & 1) == 0) {
      if (((local_37 & 1) == 0) && (local_48 == 0)) {
        isSigned = ConstantRange::isLittleEndian(&local_40);
        SVInt::SVInt(in_stack_ffffffffffffff20,(bitwidth_t)((ulong)pCVar1 >> 0x20),(uint64_t)in_RDI,
                     (bool)isSigned);
        slang::ConstantValue::ConstantValue
                  (in_RDI,(SVInt *)CONCAT17(isSigned,in_stack_ffffffffffffff08));
        SVInt::~SVInt(in_stack_ffffffffffffff20);
      }
      else {
        SVInt::SVInt(in_stack_ffffffffffffff20,(bitwidth_t)((ulong)pCVar1 >> 0x20),(uint64_t)in_RDI,
                     (bool)in_stack_ffffffffffffff0f);
        slang::ConstantValue::ConstantValue
                  (in_RDI,(SVInt *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
        SVInt::~SVInt(in_stack_ffffffffffffff20);
      }
    }
    else {
      SVInt::createFillX(in_stack_ffffffffffffff2c,(bool)in_stack_ffffffffffffff2b);
      slang::ConstantValue::ConstantValue
                (in_RDI,(SVInt *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      SVInt::~SVInt(in_stack_ffffffffffffff20);
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              (in_RDI,(nullptr_t)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  }
  ArrayQueryFunction::DimResult::~DimResult((DimResult *)0xb2a9d9);
  return pCVar1;
}

Assistant:

ConstantValue IncrementFunction::eval(EvalContext& context, const Args& args, SourceRange,
                                      const CallExpression::SystemCallInfo&) const {
    DimResult dim = getDim(context, args);
    if (dim.hardFail)
        return nullptr;

    if (dim.outOfRange)
        return SVInt::createFillX(32, true);

    if (dim.isDynamic || dim.indexType)
        return SVInt(32, uint64_t(-1), true);

    return SVInt(32, uint64_t(dim.range.isLittleEndian() ? 1 : -1), true);
}